

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall
cmCTestRunTest::WriteLogOutputTop(cmCTestRunTest *this,size_t completed,size_t total)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  ostream *poVar5;
  reference pbVar6;
  char *pcVar7;
  string local_6f0 [32];
  undefined1 local_6d0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_558 [32];
  string local_538 [32];
  undefined1 local_518 [8];
  ostringstream cmCTestLog_msg;
  string *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string outname;
  string local_358 [4];
  int maxTestNameWidth;
  int local_334;
  undefined1 local_330 [8];
  ostringstream indexStr;
  undefined1 local_198 [8];
  ostringstream outputStream;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (this->NumberOfRunsLeft != 1) {
    bVar2 = cmCTest::GetTestProgressOutput(this->CTest);
    if (!bVar2) {
      iVar3 = getNumWidth(total);
      _Var4 = std::setw(iVar3);
      poVar5 = std::operator<<((ostream *)local_198,_Var4);
      std::operator<<(poVar5,"  ");
      iVar3 = getNumWidth(total);
      _Var4 = std::setw(iVar3);
      poVar5 = std::operator<<((ostream *)local_198,_Var4);
      std::operator<<(poVar5,"  ");
      goto LAB_0024fb05;
    }
  }
  iVar3 = getNumWidth(total);
  _Var4 = std::setw(iVar3);
  poVar5 = std::operator<<((ostream *)local_198,_Var4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,completed);
  std::operator<<(poVar5,"/");
  iVar3 = getNumWidth(total);
  _Var4 = std::setw(iVar3);
  poVar5 = std::operator<<((ostream *)local_198,_Var4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,total);
  std::operator<<(poVar5," ");
LAB_0024fb05:
  if ((this->TestHandler->MemCheck & 1U) == 0) {
    std::operator<<((ostream *)local_198,"Test");
  }
  else {
    std::operator<<((ostream *)local_198,"MemCheck");
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  poVar5 = std::operator<<((ostream *)local_330," #");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->Index);
  std::operator<<(poVar5,":");
  iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
  iVar3 = getNumWidth((long)iVar3);
  local_334 = (int)std::setw(iVar3 + 3);
  poVar5 = std::operator<<((ostream *)local_198,(_Setw)local_334);
  std::__cxx11::ostringstream::str();
  std::operator<<(poVar5,local_358);
  std::__cxx11::string::~string(local_358);
  std::operator<<((ostream *)local_198," ");
  outname.field_2._12_4_ = cmCTest::GetMaxTestNameWidth(this->CTest);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 &this->TestProperties->Name," ");
  std::__cxx11::string::resize((ulong)&__range1,(char)outname.field_2._12_4_ + '\x04');
  std::operator<<((ostream *)local_198,(string *)&__range1);
  poVar5 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar5 = std::operator<<(poVar5,"/");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->TestHandler->TotalNumberOfTests);
  poVar5 = std::operator<<(poVar5," Testing: ");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = (ostream *)
           std::ostream::operator<<(this->TestHandler->LogFile,this->TestProperties->Index);
  poVar5 = std::operator<<(poVar5,"/");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->TestHandler->TotalNumberOfTests);
  poVar5 = std::operator<<(poVar5," Test: ");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(this->TestHandler->LogFile,"Command: \"");
  poVar5 = std::operator<<(poVar5,(string *)&this->ActualCommand);
  std::operator<<(poVar5,"\"");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Arguments);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Arguments);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar2) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    poVar5 = std::operator<<(this->TestHandler->LogFile," \"");
    poVar5 = std::operator<<(poVar5,(string *)pbVar6);
    std::operator<<(poVar5,"\"");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (this->TestHandler->LogFile,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"Directory: ");
  poVar5 = std::operator<<(poVar5,(string *)&this->TestProperties->Directory);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  poVar5 = std::operator<<(poVar5,"\" start time: ");
  poVar5 = std::operator<<(poVar5,(string *)&this->StartTime);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(this->TestHandler->LogFile,"Output:");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"----------------------------------------------------------");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(this->TestHandler->LogFile,(string *)&this->ProcessOutput);
  poVar5 = std::operator<<(poVar5,"<end of output>");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  bVar2 = cmCTest::GetTestProgressOutput(this->CTest);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)local_518,local_538);
    std::__cxx11::string::~string(local_538);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x2e7,pcVar7,false);
    std::__cxx11::string::~string(local_558);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d0);
  poVar5 = std::operator<<((ostream *)local_6d0,"Testing ");
  poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
  std::operator<<(poVar5," ... ");
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2eb,pcVar7,false);
  std::__cxx11::string::~string(local_6f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d0);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void cmCTestRunTest::WriteLogOutputTop(size_t completed, size_t total)
{
  std::ostringstream outputStream;

  // If this is the last or only run of this test, or progress output is
  // requested, then print out completed / total.
  // Only issue is if a test fails and we are running until fail
  // then it will never print out the completed / total, same would
  // got for run until pass.  Trick is when this is called we don't
  // yet know if we are passing or failing.
  if (this->NumberOfRunsLeft == 1 || this->CTest->GetTestProgressOutput()) {
    outputStream << std::setw(getNumWidth(total)) << completed << "/";
    outputStream << std::setw(getNumWidth(total)) << total << " ";
  }
  // if this is one of several runs of a test just print blank space
  // to keep things neat
  else {
    outputStream << std::setw(getNumWidth(total)) << "  ";
    outputStream << std::setw(getNumWidth(total)) << "  ";
  }

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
  std::string outname = this->TestProperties->Name + " ";
  outname.resize(maxTestNameWidth + 4, '.');
  outputStream << outname;

  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Testing: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << this->TestProperties->Index << "/"
                              << this->TestHandler->TotalNumberOfTests
                              << " Test: " << this->TestProperties->Name
                              << std::endl;
  *this->TestHandler->LogFile << "Command: \"" << this->ActualCommand << "\"";

  for (std::string const& arg : this->Arguments) {
    *this->TestHandler->LogFile << " \"" << arg << "\"";
  }
  *this->TestHandler->LogFile
    << std::endl
    << "Directory: " << this->TestProperties->Directory << std::endl
    << "\"" << this->TestProperties->Name
    << "\" start time: " << this->StartTime << std::endl;

  *this->TestHandler->LogFile
    << "Output:" << std::endl
    << "----------------------------------------------------------"
    << std::endl;
  *this->TestHandler->LogFile << this->ProcessOutput << "<end of output>"
                              << std::endl;

  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, outputStream.str());
  }

  cmCTestLog(this->CTest, DEBUG,
             "Testing " << this->TestProperties->Name << " ... ");
}